

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_table_function.cpp
# Opt level: O2

bool __thiscall
duckdb::Binder::BindTableFunctionParameters
          (Binder *this,TableFunctionCatalogEntry *table_function,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *expressions,vector<duckdb::LogicalType,_true> *arguments,
          vector<duckdb::Value,_true> *parameters,named_parameter_map_t *named_parameters,
          unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
          *subquery,ErrorData *error)

{
  pointer puVar1;
  ClientContext *pCVar2;
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> _Var3;
  byte bVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ulong in_RAX;
  pointer pPVar9;
  reference pvVar10;
  BaseExpression *pBVar11;
  ComparisonExpression *pCVar12;
  ColumnRefExpression *this_00;
  pointer pEVar13;
  type expr_00;
  mapped_type *this_01;
  Binder *pBVar14;
  SubqueryExpression *pSVar15;
  pointer pSVar16;
  pointer pBVar17;
  type other;
  pointer pBVar18;
  ParameterNotResolvedException *this_02;
  BinderException *this_03;
  InternalException *pIVar19;
  long lVar20;
  pointer pLVar21;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range1;
  ulong __n;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr;
  pointer this_04;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  bool bVar22;
  bool bVar23;
  allocator local_3a5;
  undefined4 local_3a4;
  LogicalType *local_3a0;
  undefined1 local_398 [16];
  Binder *local_388;
  string parameter_name;
  undefined1 local_348 [32];
  Value constant;
  ErrorData local_2d8;
  LogicalType sql_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  LogicalType local_220;
  string local_208;
  TableFunctionBinder binder;
  
  this_04 = (expressions->
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (expressions->
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_398._8_8_ = arguments;
  local_388 = this;
  do {
    bVar22 = this_04 == puVar1;
    local_3a4 = (undefined4)CONCAT71((int7)(in_RAX >> 8),!bVar22);
    if (bVar22) goto LAB_006039f6;
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(this_04);
    uVar7 = (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[5])(pPVar9);
    in_RAX = (ulong)uVar7;
    this_04 = this_04 + 1;
  } while ((char)uVar7 != '\0');
  bVar22 = false;
  bVar4 = 0;
  bVar23 = false;
  local_3a0 = (LogicalType *)expressions;
  for (__n = 0; lVar20 = (long)(table_function->functions).super_FunctionSet<duckdb::TableFunction>.
                               functions.
                               super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                               .
                               super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(table_function->functions).super_FunctionSet<duckdb::TableFunction>.
                               functions.
                               super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                               .
                               super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                               ._M_impl.super__Vector_impl_data._M_start,
      __n < (ulong)(lVar20 / 0x1b8); __n = __n + 1) {
    pvVar10 = vector<duckdb::TableFunction,_true>::get<true>
                        (&(table_function->functions).super_FunctionSet<duckdb::TableFunction>.
                          functions,__n);
    for (pLVar21 = (pvVar10->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pLVar21 !=
        (pvVar10->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments.
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish; pLVar21 = pLVar21 + 1) {
      bVar23 = (bool)(bVar23 | pLVar21->id_ == TABLE);
    }
    bVar6 = true;
    if ((((pvVar10->in_out_function == (table_in_out_function_t)0x0) &&
         (bVar4 = 1, bVar6 = bVar22, pvVar10->function == (table_function_t)0x0)) &&
        (pvVar10->bind_replace == (table_function_bind_replace_t)0x0)) &&
       (pvVar10->bind_operator == (table_function_bind_operator_t)0x0)) {
      pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&binder,
                 "Function \"%s\" has neither in_out_function nor function defined",
                 (allocator *)local_348);
      ::std::__cxx11::string::string
                ((string *)&local_2d8,
                 (string *)
                 &(table_function->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                  super_CatalogEntry.name);
      InternalException::InternalException<std::__cxx11::string>
                (pIVar19,(string *)&binder,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d8);
      __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar22 = bVar6;
  }
  expressions = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 *)local_3a0;
  this = local_388;
  if (bVar23) {
    if (lVar20 != 0x1b8) {
      pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&binder,
                 "Function \"%s\" has a TABLE parameter, and multiple function overloads - this is not supported"
                 ,(allocator *)local_348);
      ::std::__cxx11::string::string
                ((string *)&constant,
                 (string *)
                 &(table_function->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                  super_CatalogEntry.name);
      InternalException::InternalException<std::__cxx11::string>
                (pIVar19,(string *)&binder,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&constant);
      __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if ((bool)(bVar4 & bVar22)) {
      pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&binder,"Function \"%s\" is both an in_out_function and a table function"
                 ,(allocator *)local_348);
      ::std::__cxx11::string::string
                ((string *)&parameter_name,
                 (string *)
                 &(table_function->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                  super_CatalogEntry.name);
      InternalException::InternalException<std::__cxx11::string>
                (pIVar19,(string *)&binder,&parameter_name);
      __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (bVar22) {
      BindTableInTableOutFunction
                (local_388,
                 (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)local_3a0,subquery);
      pBVar17 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
                ::operator->(subquery);
      pBVar18 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar17->subquery);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 local_398._8_8_,
                 &(pBVar18->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      return true;
    }
    local_3a4 = 0;
  }
LAB_006039f6:
  result_type.ptr =
       (LogicalType *)
       (expressions->
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a0 = (LogicalType *)
              (expressions->
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  bVar22 = false;
  do {
    bVar23 = result_type.ptr == local_3a0;
    if (bVar23) {
      return bVar23;
    }
    parameter_name._M_dataplus._M_p = (pointer)&parameter_name.field_2;
    parameter_name._M_string_length = 0;
    parameter_name.field_2._M_local_buf[0] = '\0';
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)result_type.ptr);
    if ((pPVar9->super_BaseExpression).type == COMPARE_BOUNDARY_START) {
      pBVar11 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)result_type.ptr)->super_BaseExpression;
      pCVar12 = BaseExpression::Cast<duckdb::ComparisonExpression>(pBVar11);
      pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(&pCVar12->left);
      if ((pPVar9->super_BaseExpression).type == COLUMN_REF) {
        pBVar11 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(&pCVar12->left)->super_BaseExpression;
        this_00 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar11);
        bVar6 = ColumnRefExpression::IsQualified(this_00);
        if (!bVar6) {
          ColumnRefExpression::GetColumnName_abi_cxx11_(this_00);
          ::std::__cxx11::string::_M_assign((string *)&parameter_name);
          ::std::
          __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ::operator=((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       *)result_type.ptr,
                      (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       *)&pCVar12->right);
        }
      }
    }
    else {
      pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)result_type.ptr);
      if ((pPVar9->super_BaseExpression).alias._M_string_length != 0) {
        unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)result_type.ptr);
        ::std::__cxx11::string::_M_assign((string *)&parameter_name);
      }
    }
    if (((char)local_3a4 == '\0') ||
       (pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)result_type.ptr), (pPVar9->super_BaseExpression).type != SUBQUERY))
    {
      pCVar2 = this->context;
      ::std::__cxx11::string::string
                ((string *)&local_208,
                 (string *)
                 &(table_function->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                  super_CatalogEntry.name);
      TableFunctionBinder::TableFunctionBinder(&binder,this,pCVar2,&local_208);
      ::std::__cxx11::string::~string((string *)&local_208);
      LogicalType::LogicalType(&sql_type);
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_398,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&binder,result_type,SUB81(&sql_type,0));
      pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_398);
      iVar8 = (*(pEVar13->super_BaseExpression)._vptr_BaseExpression[6])(pEVar13);
      if ((char)iVar8 != '\0') {
        this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
        ParameterNotResolvedException::ParameterNotResolvedException(this_02);
        __cxa_throw(this_02,&ParameterNotResolvedException::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
      pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_398);
      iVar8 = (*(pEVar13->super_BaseExpression)._vptr_BaseExpression[5])(pEVar13);
      if ((char)iVar8 == '\0') {
        pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_2d8,"Table function requires a constant parameter",
                   (allocator *)&constant);
        InternalException::InternalException(pIVar19,(string *)&local_2d8);
        __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pCVar2 = this->context;
      expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)local_398);
      ExpressionExecutor::EvaluateScalar(&constant,pCVar2,expr_00,true);
      if (parameter_name._M_string_length == 0) {
        if ((named_parameters->_M_h)._M_element_count == 0) {
          if (constant.is_null == true) {
            LogicalType::LogicalType((LogicalType *)&local_2d8,SQLNULL);
          }
          else {
            LogicalType::LogicalType((LogicalType *)&local_2d8,&sql_type);
          }
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
          emplace_back<duckdb::LogicalType>
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                     local_398._8_8_,(LogicalType *)&local_2d8);
          LogicalType::~LogicalType((LogicalType *)&local_2d8);
          iVar8 = 0;
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)parameters,&constant);
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)local_348,"Unnamed parameters cannot come after named parameters",
                     &local_3a5);
          ErrorData::ErrorData(&local_2d8,(string *)local_348);
          ErrorData::operator=(error,&local_2d8);
          ErrorData::~ErrorData(&local_2d8);
          ::std::__cxx11::string::~string((string *)local_348);
          iVar8 = 1;
        }
      }
      else {
        this_01 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)named_parameters,&parameter_name);
        Value::operator=(this_01,&constant);
        iVar8 = 0;
      }
      Value::~Value(&constant);
      if ((Expression *)local_398._0_8_ != (Expression *)0x0) {
        (**(code **)(*(_func_int **)local_398._0_8_ + 8))();
      }
      LogicalType::~LogicalType(&sql_type);
      TableFunctionBinder::~TableFunctionBinder(&binder);
    }
    else {
      FunctionSet<duckdb::TableFunction>::GetFunctionByOffset
                ((TableFunction *)&binder,
                 &(table_function->functions).super_FunctionSet<duckdb::TableFunction>,0);
      if (((long)(table_function->functions).super_FunctionSet<duckdb::TableFunction>.functions.
                 super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                 super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(table_function->functions).super_FunctionSet<duckdb::TableFunction>.functions.
                 super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                 super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                 _M_impl.super__Vector_impl_data._M_start != 0x1b8) ||
         (binder.super_ExpressionBinder.stored_binder.ptr ==
          (ExpressionBinder *)
          binder.super_ExpressionBinder.bound_columns.
          super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
          .
          super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        this_03 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_2d8,
                   "Only table-in-out functions can have subquery parameters - %s only accepts constant parameters"
                   ,(allocator *)&constant);
        ::std::__cxx11::string::string
                  ((string *)&local_240,(string *)&binder.super_ExpressionBinder.target_type);
        BinderException::BinderException<std::__cxx11::string>
                  (this_03,(string *)&local_2d8,&local_240);
        __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (bVar22) {
        ::std::__cxx11::string::string
                  ((string *)&constant,"Table function can have at most one subquery parameter",
                   (allocator *)local_348);
        ErrorData::ErrorData(&local_2d8,(string *)&constant);
        ErrorData::operator=(error,&local_2d8);
        ErrorData::~ErrorData(&local_2d8);
        ::std::__cxx11::string::~string((string *)&constant);
        iVar8 = 1;
      }
      else {
        CreateBinder((Binder *)&constant,this->context,(optional_ptr<duckdb::Binder,_true>)this,
                     REGULAR_BINDER);
        pBVar14 = shared_ptr<duckdb::Binder,_true>::operator->
                            ((shared_ptr<duckdb::Binder,_true> *)&constant);
        pBVar14->can_contain_nulls = true;
        pBVar11 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)result_type.ptr)->super_BaseExpression;
        pSVar15 = BaseExpression::Cast<duckdb::SubqueryExpression>(pBVar11);
        pBVar14 = shared_ptr<duckdb::Binder,_true>::operator->
                            ((shared_ptr<duckdb::Binder,_true> *)&constant);
        pSVar16 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                  ::operator->(&pSVar15->subquery);
        unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
                  (&pSVar16->node);
        BindNode((Binder *)local_348,(QueryNode *)pBVar14);
        make_uniq<duckdb::BoundSubqueryRef,duckdb::shared_ptr<duckdb::Binder,true>,duckdb::unique_ptr<duckdb::BoundQueryNode,std::default_delete<duckdb::BoundQueryNode>,true>>
                  ((duckdb *)&local_2d8,(shared_ptr<duckdb::Binder,_true> *)&constant,
                   (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                    *)local_348);
        uVar5 = local_2d8._0_8_;
        local_2d8._0_8_ = (BoundSubqueryRef *)0x0;
        _Var3._M_head_impl =
             (subquery->
             super_unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BoundSubqueryRef_*,_std::default_delete<duckdb::BoundSubqueryRef>_>
             .super__Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false>._M_head_impl;
        (subquery->
        super_unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::BoundSubqueryRef_*,_std::default_delete<duckdb::BoundSubqueryRef>_>
        .super__Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false>._M_head_impl =
             (BoundSubqueryRef *)uVar5;
        if ((_Var3._M_head_impl != (BoundSubqueryRef *)0x0) &&
           ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_BoundTableRef + 8))(),
           (BoundSubqueryRef *)local_2d8._0_8_ != (BoundSubqueryRef *)0x0)) {
          (*(code *)(*(__node_base_ptr *)local_2d8._0_8_)[1]._M_nxt)();
        }
        pBVar17 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
                  ::operator->(subquery);
        other = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar17->binder);
        MoveCorrelatedExpressions(this,other);
        local_2d8.initialized = true;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
        emplace_back<duckdb::LogicalTypeId>
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   local_398._8_8_,(LogicalTypeId *)&local_2d8);
        LogicalType::LogicalType(&local_220,SQLNULL);
        Value::Value((Value *)&local_2d8,&local_220);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)parameters,
                   (Value *)&local_2d8);
        Value::~Value((Value *)&local_2d8);
        LogicalType::~LogicalType(&local_220);
        if ((pointer)local_348._0_8_ != (pointer)0x0) {
          (**(code **)(*(long *)local_348._0_8_ + 8))();
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&constant.type_.type_info_);
        iVar8 = 3;
      }
      TableFunction::~TableFunction((TableFunction *)&binder);
      bVar22 = true;
    }
    ::std::__cxx11::string::~string((string *)&parameter_name);
    if ((iVar8 != 3) && (iVar8 != 0)) {
      return bVar23;
    }
    result_type.ptr = (LogicalType *)&(result_type.ptr)->type_info_;
    this = local_388;
  } while( true );
}

Assistant:

bool Binder::BindTableFunctionParameters(TableFunctionCatalogEntry &table_function,
                                         vector<unique_ptr<ParsedExpression>> &expressions,
                                         vector<LogicalType> &arguments, vector<Value> &parameters,
                                         named_parameter_map_t &named_parameters,
                                         unique_ptr<BoundSubqueryRef> &subquery, ErrorData &error) {
	auto bind_type = GetTableFunctionBindType(table_function, expressions);
	if (bind_type == TableFunctionBindType::TABLE_IN_OUT_FUNCTION) {
		// bind table in-out function
		BindTableInTableOutFunction(expressions, subquery);
		// fetch the arguments from the subquery
		arguments = subquery->subquery->types;
		return true;
	}
	bool seen_subquery = false;
	for (auto &child : expressions) {
		string parameter_name;

		// hack to make named parameters work
		if (child->GetExpressionType() == ExpressionType::COMPARE_EQUAL) {
			// comparison, check if the LHS is a columnref
			auto &comp = child->Cast<ComparisonExpression>();
			if (comp.left->GetExpressionType() == ExpressionType::COLUMN_REF) {
				auto &colref = comp.left->Cast<ColumnRefExpression>();
				if (!colref.IsQualified()) {
					parameter_name = colref.GetColumnName();
					child = std::move(comp.right);
				}
			}
		} else if (!child->GetAlias().empty()) {
			// <name> => <expression> will set the alias of <expression> to <name>
			parameter_name = child->GetAlias();
		}
		if (bind_type == TableFunctionBindType::TABLE_PARAMETER_FUNCTION &&
		    child->GetExpressionType() == ExpressionType::SUBQUERY) {
			D_ASSERT(table_function.functions.Size() == 1);
			auto fun = table_function.functions.GetFunctionByOffset(0);
			if (table_function.functions.Size() != 1 || fun.arguments.empty()) {
				throw BinderException(
				    "Only table-in-out functions can have subquery parameters - %s only accepts constant parameters",
				    fun.name);
			}
			if (seen_subquery) {
				error = ErrorData("Table function can have at most one subquery parameter");
				return false;
			}
			auto binder = Binder::CreateBinder(this->context, this);
			binder->can_contain_nulls = true;
			auto &se = child->Cast<SubqueryExpression>();
			auto node = binder->BindNode(*se.subquery->node);
			subquery = make_uniq<BoundSubqueryRef>(std::move(binder), std::move(node));
			MoveCorrelatedExpressions(*subquery->binder);
			seen_subquery = true;
			arguments.emplace_back(LogicalTypeId::TABLE);
			parameters.emplace_back(Value());
			continue;
		}

		TableFunctionBinder binder(*this, context, table_function.name);
		LogicalType sql_type;
		auto expr = binder.Bind(child, &sql_type);
		if (expr->HasParameter()) {
			throw ParameterNotResolvedException();
		}
		if (!expr->IsScalar()) {
			// should have been eliminated before
			throw InternalException("Table function requires a constant parameter");
		}
		auto constant = ExpressionExecutor::EvaluateScalar(context, *expr, true);
		if (parameter_name.empty()) {
			// unnamed parameter
			if (!named_parameters.empty()) {
				error = ErrorData("Unnamed parameters cannot come after named parameters");
				return false;
			}
			arguments.emplace_back(constant.IsNull() ? LogicalType::SQLNULL : sql_type);
			parameters.emplace_back(std::move(constant));
		} else {
			named_parameters[parameter_name] = std::move(constant);
		}
	}
	return true;
}